

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O1

void __thiscall
TasGrid::GridLocalPolynomial::addChildLimited<(TasGrid::RuleLocal::erule)3>
          (GridLocalPolynomial *this,int *point,int direction,MultiIndexSet *exclude,
          vector<int,_std::allocator<int>_> *level_limits,Data2D<int> *destination)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  bool bVar5;
  vector<int,_std::allocator<int>_> kid;
  allocator_type local_51;
  int *local_50 [2];
  long local_40;
  vector<int,std::allocator<int>> *local_38;
  
  ::std::vector<int,std::allocator<int>>::vector<int_const*,void>
            ((vector<int,std::allocator<int>> *)local_50,point,
             point + (this->super_BaseCanonicalGrid).num_dimensions,&local_51);
  local_38 = (vector<int,std::allocator<int>> *)&destination->vec;
  iVar4 = 0;
  do {
    iVar1 = point[direction] * 2 - (uint)(iVar4 == 0);
    iVar2 = iVar1 + 2;
    local_50[0][direction] = iVar2;
    if (iVar2 != -1) {
      iVar2 = (level_limits->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start[direction];
      if (iVar2 != -1) {
        uVar3 = iVar1 + 3;
        iVar1 = 0;
        if (1 < uVar3) {
          iVar1 = 0;
          do {
            uVar3 = (int)uVar3 >> 1;
            iVar1 = iVar1 + 1;
          } while (1 < uVar3);
        }
        if (iVar2 < iVar1) goto LAB_001a474b;
      }
      iVar1 = MultiIndexSet::getSlot(exclude,local_50[0]);
      if (iVar1 == -1) {
        ::std::vector<int,std::allocator<int>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                  (local_38,(destination->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl
                            .super__Vector_impl_data._M_finish,local_50[0],
                   local_50[0] + destination->stride);
        destination->num_strips = destination->num_strips + 1;
      }
    }
LAB_001a474b:
    bVar5 = iVar4 != 0;
    iVar4 = iVar4 + 1;
    if (bVar5) {
      if (local_50[0] != (int *)0x0) {
        operator_delete(local_50[0],local_40 - (long)local_50[0]);
      }
      return;
    }
  } while( true );
}

Assistant:

void GridLocalPolynomial::addChildLimited(const int point[], int direction, const MultiIndexSet &exclude, const std::vector<int> &level_limits, Data2D<int> &destination) const{
    std::vector<int> kid(point, point + num_dimensions);
    int max_1d_kids = RuleLocal::getMaxNumKids<effrule>();
    for(int i=0; i<max_1d_kids; i++){
        kid[direction] = RuleLocal::getKid<effrule>(point[direction], i);
        if ((kid[direction] != -1)
            && ((level_limits[direction] == -1) || (RuleLocal::getLevel<effrule>(kid[direction]) <= level_limits[direction]))
            && exclude.missing(kid)){
            destination.appendStrip(kid);
        }
    }
}